

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar xVar1;
  xmlType xVar2;
  xmlChar *pxVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  unsigned_long uVar6;
  xmlCharEncoding enc;
  xmlDocPtr pxVar7;
  xmlChar start [4];
  xmlChar local_1c;
  xmlChar local_1b;
  xmlChar local_1a;
  xmlChar local_19;
  
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->encoding == (xmlChar *)0x0) &&
     (pxVar3 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar3)) {
    local_1c = *pxVar3;
    local_1b = pxVar3[1];
    local_1a = pxVar3[2];
    local_19 = pxVar3[3];
    enc = xmlDetectCharEncoding(&local_1c,4);
    if (enc != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc);
    }
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar3 = ctxt->input->cur;
    if (((*pxVar3 != '?') || (pxVar3[1] != 'x')) || (pxVar3[2] != 'm')) goto LAB_00163b3f;
    xVar1 = pxVar3[3];
  }
  else {
    if (((ctxt->mlType != XML_TYPE_XML) || (pxVar3 = ctxt->input->cur, *pxVar3 != '<')) ||
       ((pxVar3[1] != '?' || ((pxVar3[2] != 'x' || (pxVar3[3] != 'm')))))) goto LAB_00163b3f;
    xVar1 = pxVar3[4];
  }
  if ((xVar1 == 'l') && (xmlParseTextDecl(ctxt), ctxt->errNo == 0x20)) {
    xmlHaltParser(ctxt);
    return;
  }
LAB_00163b3f:
  if (ctxt->myDoc == (xmlDocPtr)0x0) {
    pxVar7 = xmlNewDoc("1.0");
    ctxt->myDoc = pxVar7;
    if (pxVar7 == (xmlDocPtr)0x0) {
      xmlErrMemory(ctxt,"New Doc failed");
      return;
    }
    pxVar7->properties = 0x40;
  }
  pxVar7 = ctxt->myDoc;
  if ((pxVar7 != (xmlDocPtr)0x0) && (pxVar7->intSubset == (_xmlDtd *)0x0)) {
    xmlCreateIntSubset(pxVar7,(xmlChar *)0x0,ExternalID,SystemID);
  }
  ctxt->instate = XML_PARSER_DTD;
  ctxt->external = 1;
  xmlSkipBlankChars(ctxt);
  do {
    xVar2 = ctxt->mlType;
    if (((((((xVar2 != XML_TYPE_XML) || (pxVar3 = ctxt->input->cur, *pxVar3 != '<')) ||
           (pxVar3[1] != '?')) && ((xVar2 != XML_TYPE_SML || (*ctxt->input->cur != '?')))) &&
         ((xVar2 != XML_TYPE_XML ||
          ((pxVar3 = ctxt->input->cur, *pxVar3 != '<' || (pxVar3[1] != '!')))))) &&
        ((xVar2 != XML_TYPE_SML || (*ctxt->input->cur != '!')))) && (*ctxt->input->cur != '%'))
    goto LAB_00163cbb;
    pxVar4 = ctxt->input;
    pxVar3 = pxVar4->cur;
    uVar6 = pxVar4->consumed;
    if ((ctxt->progressive == 0) && ((long)pxVar4->end - (long)pxVar3 < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->mlType == XML_TYPE_SML) {
      pxVar5 = ctxt->input->cur;
      if ((*pxVar5 == '!') && (pxVar5[1] == '[')) goto LAB_00163c7a;
LAB_00163c84:
      xmlParseMarkupDecl(ctxt);
    }
    else {
      if ((ctxt->mlType != XML_TYPE_XML) ||
         (((pxVar5 = ctxt->input->cur, *pxVar5 != '<' || (pxVar5[1] != '!')) || (pxVar5[2] != '[')))
         ) goto LAB_00163c84;
LAB_00163c7a:
      xmlParseConditionalSections(ctxt);
    }
    xmlSkipBlankChars(ctxt);
  } while ((ctxt->input->cur != pxVar3) || ((ulong)(uint)uVar6 != ctxt->input->consumed));
  xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_00163cbb:
  if (*ctxt->input->cur != '\0') {
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    xmlDetectSAX2(ctxt);
    GROW;

    if ((ctxt->encoding == NULL) &&
        (ctxt->input->end - ctxt->input->cur >= 4)) {
        xmlChar start[4];
	xmlCharEncoding enc;

	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE)
	    xmlSwitchEncoding(ctxt, enc);
    }

    if (CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    xmlHaltParser(ctxt);
	    return;
	}
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt, "New Doc failed");
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL))
        xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID);

    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    SKIP_BLANKS;
    while ((CMP2_MLI(CUR_PTR, '<', '?')) ||
           (CMP2_MLI(CUR_PTR, '<', '!')) ||
	   (RAW == '%')) {
	const xmlChar *check = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	GROW;
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
	    xmlParseConditionalSections(ctxt);
	} else
	    xmlParseMarkupDecl(ctxt);
        SKIP_BLANKS;

	if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
	    xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
	    break;
	}
    }

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }

}